

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O3

void __thiscall PatternModel::transpose(PatternModel *this,int amount)

{
  uint8_t dataOld;
  uint8_t dataNew;
  TransposeCmd *this_00;
  TrackRow *pTVar1;
  TrackEditCmd *this_01;
  QUndoStack *pQVar2;
  TrackRow rowcopy;
  QArrayData *local_40 [3];
  TrackRow local_28;
  
  if (amount != 0) {
    if (this->mHasSelection == true) {
      this_00 = (TransposeCmd *)operator_new(0x48);
      TransposeCmd::TransposeCmd(this_00,this,(int8_t)amount);
      QMetaObject::tr((char *)local_40,(char *)&staticMetaObject,0x1b5f49);
      QUndoCommand::setText((QString *)this_00);
    }
    else {
      pTVar1 = trackerboy::Pattern::getTrackRow
                         (&this->mPatternCurr,(ChType)(this->mCursor).super_PatternCursorBase.track,
                          (uint)(ushort)(this->mCursor).super_PatternCursorBase.row);
      local_28 = *pTVar1;
      trackerboy::TrackRow::transpose(&local_28,amount);
      dataNew = local_28.note;
      dataOld = pTVar1->note;
      if (local_28.note == dataOld) {
        return;
      }
      this_01 = (TrackEditCmd *)operator_new(0x20);
      TrackEditCmd::TrackEditCmd(this_01,this,dataNew,dataOld,(QUndoCommand *)0x0);
      *(undefined ***)this_01 = &PTR__QUndoCommand_00200808;
      QMetaObject::tr((char *)local_40,(char *)&staticMetaObject,0x1b5f5d);
      QUndoCommand::setText((QString *)this_01);
    }
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,8);
      }
    }
    pQVar2 = Module::undoStack(this->mModule);
    QUndoStack::push((QUndoCommand *)pQVar2);
  }
  return;
}

Assistant:

void PatternModel::transpose(int amount) {

    if (amount) { // a transpose of 0 does nothing
        if (hasSelection()) {
            auto cmd = new TransposeCmd(*this, (int8_t)amount);
            cmd->setText(tr("transpose selection"));
            mModule.undoStack()->push(cmd);
        } else {
            auto &rowdata = cursorTrackRow();
            auto rowcopy = rowdata;
            rowcopy.transpose(amount);
            // if the transpose resulted in a change, create and push an edit command
            if (rowcopy.note != rowdata.note) {
                auto cmd = new NoteEditCmd(*this, rowcopy.note, rowdata.note);
                cmd->setText(tr("transpose note"));
                mModule.undoStack()->push(cmd);
            }

        }
    }
}